

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_add_ellipse(plutovg_path_t *path,float cx,float cy,float rx,float ry)

{
  float x2;
  float y;
  float x2_00;
  float y2;
  float fVar1;
  float fVar2;
  float cpy;
  float cpx;
  float bottom;
  float right;
  float top;
  float left;
  float ry_local;
  float rx_local;
  float cy_local;
  float cx_local;
  plutovg_path_t *path_local;
  
  x2 = cx - rx;
  y = cy - ry;
  x2_00 = cx + rx;
  y2 = cy + ry;
  fVar1 = rx * 0.5522848;
  fVar2 = ry * 0.5522848;
  plutovg_path_reserve(path,0x14);
  plutovg_path_move_to(path,cx,y);
  plutovg_path_cubic_to(path,cx + fVar1,y,x2_00,cy - fVar2,x2_00,cy);
  plutovg_path_cubic_to(path,x2_00,cy + fVar2,cx + fVar1,y2,cx,y2);
  plutovg_path_cubic_to(path,cx - fVar1,y2,x2,cy + fVar2,x2,cy);
  plutovg_path_cubic_to(path,x2,cy - fVar2,cx - fVar1,y,cx,y);
  plutovg_path_close(path);
  return;
}

Assistant:

void plutovg_path_add_ellipse(plutovg_path_t* path, float cx, float cy, float rx, float ry)
{
    float left = cx - rx;
    float top = cy - ry;
    float right = cx + rx;
    float bottom = cy + ry;

    float cpx = rx * PLUTOVG_KAPPA;
    float cpy = ry * PLUTOVG_KAPPA;

    plutovg_path_reserve(path, 2 * 2 + 4 * 4);
    plutovg_path_move_to(path, cx, top);
    plutovg_path_cubic_to(path, cx+cpx, top, right, cy-cpy, right, cy);
    plutovg_path_cubic_to(path, right, cy+cpy, cx+cpx, bottom, cx, bottom);
    plutovg_path_cubic_to(path, cx-cpx, bottom, left, cy+cpy, left, cy);
    plutovg_path_cubic_to(path, left, cy-cpy, cx-cpx, top, cx, top);
    plutovg_path_close(path);
}